

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Constants.cpp
# Opt level: O0

PSNodesSeq * __thiscall
dg::pta::LLVMPointerGraphBuilder::createConstantExpr(LLVMPointerGraphBuilder *this,ConstantExpr *CE)

{
  PSNodesSeq *pPVar1;
  LLVMPointerGraphBuilder *in_RSI;
  Offset *in_RDI;
  Pointer PVar2;
  PSNode *node;
  Pointer ptr;
  ConstantExpr *in_stack_00000048;
  LLVMPointerGraphBuilder *in_stack_00000050;
  PSNode **in_stack_ffffffffffffffd8;
  
  PVar2 = getConstantExprPointer(in_stack_00000050,in_stack_00000048);
  PointerGraph::create<(dg::pta::PSNodeType)18,dg::pta::PSNode*&,dg::Offset&>
            ((PointerGraph *)PVar2.target,in_stack_ffffffffffffffd8,in_RDI);
  pPVar1 = addNode(in_RSI,(Value *)PVar2.offset.offset.offset,PVar2.target);
  return pPVar1;
}

Assistant:

LLVMPointerGraphBuilder::PSNodesSeq &
LLVMPointerGraphBuilder::createConstantExpr(const llvm::ConstantExpr *CE) {
    Pointer ptr = getConstantExprPointer(CE);
    PSNode *node = PS.create<PSNodeType::CONSTANT>(ptr.target, ptr.offset);

    return addNode(CE, node);
}